

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::BeginValue(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             *this,Context *context)

{
  ValueType *this_00;
  Ch *pCVar1;
  SchemaType *pSVar2;
  
  if (context->inArray != true) {
    return true;
  }
  if (this->uniqueItems_ == true) {
    context->valueUniqueness = true;
  }
  pSVar2 = this->itemsList_;
  if (pSVar2 != (SchemaType *)0x0) goto LAB_00147fe2;
  if (this->itemsTuple_ != (SchemaType **)0x0) {
    if (context->arrayElementIndex < this->itemsTupleCount_) {
      pSVar2 = this->itemsTuple_[context->arrayElementIndex];
      goto LAB_00147fe2;
    }
    pSVar2 = this->additionalItemsSchema_;
    if (pSVar2 != (SchemaType *)0x0) goto LAB_00147fe2;
    if (this->additionalItems_ != true) {
      (*context->error_handler->_vptr_IValidationErrorHandler[0xe])();
      context->valueSchema = this->typeless_;
      context->arrayElementIndex = context->arrayElementIndex + 1;
      context->invalidCode = kValidateErrorAdditionalItems;
      this_00 = GetAdditionalItemsString();
      pCVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
      context->invalidKeyword = pCVar1;
      return false;
    }
  }
  pSVar2 = this->typeless_;
LAB_00147fe2:
  context->valueSchema = pSVar2;
  context->arrayElementIndex = context->arrayElementIndex + 1;
  return true;
}

Assistant:

bool BeginValue(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::BeginValue");
        if (context.inArray) {
            if (uniqueItems_)
                context.valueUniqueness = true;

            if (itemsList_)
                context.valueSchema = itemsList_;
            else if (itemsTuple_) {
                if (context.arrayElementIndex < itemsTupleCount_)
                    context.valueSchema = itemsTuple_[context.arrayElementIndex];
                else if (additionalItemsSchema_)
                    context.valueSchema = additionalItemsSchema_;
                else if (additionalItems_)
                    context.valueSchema = typeless_;
                else {
                    context.error_handler.DisallowedItem(context.arrayElementIndex);
                    // Must set valueSchema for when kValidateContinueOnErrorFlag is set, else reports spurious type error
                    context.valueSchema = typeless_;
                    // Must bump arrayElementIndex for when kValidateContinueOnErrorFlag is set
                    context.arrayElementIndex++;
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAdditionalItems);
                }
            }
            else
                context.valueSchema = typeless_;

            context.arrayElementIndex++;
        }
        return true;
    }